

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalSingleStoreElimPass::FindUses
          (LocalSingleStoreElimPass *this,Instruction *var_inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *users
          )

{
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *def;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_16_2_0687e84d local_58;
  function<void_(spvtools::opt::Instruction_*)> local_48;
  DefUseManager *local_28;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *users_local;
  Instruction *var_inst_local;
  LocalSingleStoreElimPass *this_local;
  
  def_use_mgr = (DefUseManager *)users;
  users_local = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)var_inst;
  var_inst_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  def = users_local;
  local_58.users =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       def_use_mgr;
  local_58.this = this;
  local_28 = this_01;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LocalSingleStoreElimPass::FindUses(spvtools::opt::Instruction_const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_48,&local_58);
  analysis::DefUseManager::ForEachUser(this_01,(Instruction *)def,&local_48);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_48);
  return;
}

Assistant:

void LocalSingleStoreElimPass::FindUses(
    const Instruction* var_inst, std::vector<Instruction*>* users) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->ForEachUser(var_inst, [users, this](Instruction* user) {
    users->push_back(user);
    if (user->opcode() == spv::Op::OpCopyObject) {
      FindUses(user, users);
    }
  });
}